

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

errr text_lines_to_file(char *path,text_writer writer)

{
  _Bool _Var1;
  ang_file *f;
  ang_file *new_file;
  char old_fname [1024];
  char new_fname [1024];
  text_writer writer_local;
  char *path_local;
  
  file_get_tempfile(old_fname + 0x3f8,0x400,path,"new");
  file_get_tempfile((char *)&new_file,0x400,path,"old");
  f = file_open(old_fname + 0x3f8,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    path_local._4_4_ = -1;
  }
  else {
    text_out_file = f;
    (*writer)(f);
    text_out_file = (ang_file *)0x0;
    file_close(f);
    _Var1 = file_exists(path);
    if (_Var1) {
      _Var1 = file_move(path,(char *)&new_file);
      if (_Var1) {
        file_move(old_fname + 0x3f8,path);
        file_delete((char *)&new_file);
      }
      else {
        file_delete(old_fname + 0x3f8);
      }
    }
    else {
      file_move(old_fname + 0x3f8,path);
    }
    path_local._4_4_ = 0;
  }
  return path_local._4_4_;
}

Assistant:

errr text_lines_to_file(const char *path, text_writer writer)
{
	char new_fname[1024];
	char old_fname[1024];

	ang_file *new_file;

	/* Format filenames */
	file_get_tempfile(new_fname, sizeof(new_fname), path, "new");
	file_get_tempfile(old_fname, sizeof(old_fname), path, "old");

	/* Write new file */
	new_file = file_open(new_fname, MODE_WRITE, FTYPE_TEXT);
	if (!new_file) {
		return -1;
	}

	text_out_file = new_file;
	writer(new_file);
	text_out_file = NULL;

	file_close(new_file);

	/* Move files around */
	if (!file_exists(path)) {
		file_move(new_fname, path);
	} else if (file_move(path, old_fname)) {
		file_move(new_fname, path);
		file_delete(old_fname);
	} else {
		file_delete(new_fname);
	}

	return 0;
}